

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_iswalpha(char16_t c)

{
  int iVar1;
  char16_t c_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = PAL_iswupper(c);
  if ((iVar1 == 0) && (iVar1 = PAL_iswlower(c), iVar1 == 0)) {
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return 0;
    }
    abort();
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return 1;
  }
  abort();
}

Assistant:

int
__cdecl
PAL_iswalpha( char16_t c )
{
    PERF_ENTRY(iswalpha);
    ENTRY( "PAL_iswalpha (c=%d)\n", c);

    if ( PAL_iswupper( c ) || PAL_iswlower( c ) )
    {
        LOGEXIT( "PAL_iswalpha returns 1.\n" );
        PERF_EXIT(iswalpha);
        return 1;
    }

    LOGEXIT( "PAL_iswalpha returns 0.\n" );
    PERF_EXIT(iswalpha);
    return 0;
}